

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O2

c_v128 c_v128_pack_s32_u16(c_v128 a,c_v128 b)

{
  c_v64 cVar1;
  c_v128 cVar2;
  
  cVar1 = c_v64_pack_s32_u16(a.v64[1],a.v64[0]);
  cVar2._0_8_ = c_v64_pack_s32_u16(b.v64[1],b.v64[0]);
  cVar2.v64[1] = (c_v64)(c_v64)cVar1.u64;
  return cVar2;
}

Assistant:

SIMD_INLINE c_v128 c_v128_pack_s32_u16(c_v128 a, c_v128 b) {
  return c_v128_from_v64(c_v64_pack_s32_u16(a.v64[1], a.v64[0]),
                         c_v64_pack_s32_u16(b.v64[1], b.v64[0]));
}